

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NonConstFuncs.cpp
# Opt level: O2

void __thiscall slang::ast::builtins::FErrorFunc::FErrorFunc(FErrorFunc *this)

{
  SystemSubroutine::SystemSubroutine(&this->super_SystemSubroutine,FError,Function);
  (this->super_SystemSubroutine)._vptr_SystemSubroutine =
       (_func_int **)&PTR__SystemSubroutine_006b2dd8;
  (this->super_SystemSubroutine).hasOutputArgs = true;
  return;
}

Assistant:

FErrorFunc() : SystemSubroutine(KnownSystemName::FError, SubroutineKind::Function) {
        hasOutputArgs = true;
    }